

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IndexedCase::iterate(IndexedCase *this)

{
  TestLog *log;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  ResultCollector result;
  IndexedCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_81);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_60,log,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,local_60);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_60,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_60);
  return STOP;
}

Assistant:

IndexedCase::IterateResult IndexedCase::iterate (void)
{
	tcu::ResultCollector result(m_testCtx.getLog(), " // ERROR: ");

	test(result);

	result.setTestContextResult(m_testCtx);
	return STOP;
}